

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void error<String,int,String,String>
               (char *fmtstr,String *args,int *args_1,String *args_2,String *args_3)

{
  String local_70;
  String local_50;
  String *local_30;
  String *args_local_3;
  String *args_local_2;
  int *args_local_1;
  String *args_local;
  char *fmtstr_local;
  
  local_30 = args_3;
  args_local_3 = args_2;
  args_local_2 = (String *)args_1;
  args_local_1 = (int *)args;
  args_local = (String *)fmtstr;
  String::String(&local_70,fmtstr);
  format<String,int,String,String>
            (&local_50,&local_70,(String *)args_local_1,(int *)args_local_2,args_local_3,local_30);
  error(&local_50);
  String::~String(&local_50);
  String::~String(&local_70);
  return;
}

Assistant:

void error (const char* fmtstr, const argtypes&... args)
{
	error (format (String (fmtstr), args...));
}